

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::insertchrs(CBString *this,int pos,int len,uchar cfill)

{
  int iVar1;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  iVar1 = binsertch(&this->super_tagbstring,pos,len,cfill);
  if (iVar1 != -1) {
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Failure in insertchrs","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::insertchrs (int pos, int len, unsigned char cfill) {
	if (BSTR_ERR == binsertch (this, pos, len, cfill)) {
		bstringThrow ("Failure in insertchrs");
	}
}